

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

int64_t __thiscall icu_63::Formattable::getInt64(Formattable *this,UErrorCode *status)

{
  double dVar1;
  Type TVar2;
  UnicodeString *pUVar3;
  bool bVar4;
  long lVar5;
  int64_t iVar6;
  
  while( true ) {
    if (U_ZERO_ERROR < *status) {
      return 0;
    }
    TVar2 = this->fType;
    if (TVar2 != kObject) break;
    pUVar3 = (this->fValue).fString;
    if (pUVar3 == (UnicodeString *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return 0;
    }
    lVar5 = __dynamic_cast(pUVar3,&UObject::typeinfo,&Measure::typeinfo,0);
    if (lVar5 == 0) goto LAB_00214839;
    this = (Formattable *)&pUVar3->fUnion;
  }
  if (TVar2 == kDouble) {
    dVar1 = (this->fValue).fDouble;
    if (9.223372036854776e+18 < dVar1) {
      *status = U_INVALID_FORMAT_ERROR;
      return 0x7fffffffffffffff;
    }
    if (dVar1 < -9.223372036854776e+18) {
      *status = U_INVALID_FORMAT_ERROR;
      return -0x8000000000000000;
    }
    if ((ABS(dVar1) <= 9007199254740992.0) || (this->fDecimalQuantity == (DecimalQuantity *)0x0)) {
      return (long)dVar1;
    }
    bVar4 = icu_63::number::impl::DecimalQuantity::fitsInLong(this->fDecimalQuantity,true);
    if (bVar4) {
      iVar6 = icu_63::number::impl::DecimalQuantity::toLong(this->fDecimalQuantity,false);
      return iVar6;
    }
    *status = U_INVALID_FORMAT_ERROR;
    bVar4 = icu_63::number::impl::DecimalQuantity::isNegative(this->fDecimalQuantity);
    if (!bVar4) {
      return 0x7fffffffffffffff;
    }
    return -0x8000000000000000;
  }
  if ((TVar2 == kInt64) || (TVar2 == kLong)) {
    return (int64_t)(this->fValue).fObject;
  }
LAB_00214839:
  *status = U_INVALID_FORMAT_ERROR;
  return 0;
}

Assistant:

int64_t
Formattable::getInt64(UErrorCode& status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
        
    switch (fType) {
    case Formattable::kLong: 
    case Formattable::kInt64: 
        return fValue.fInt64;
    case Formattable::kDouble:
        if (fValue.fDouble > (double)U_INT64_MAX) {
            status = U_INVALID_FORMAT_ERROR;
            return U_INT64_MAX;
        } else if (fValue.fDouble < (double)U_INT64_MIN) {
            status = U_INVALID_FORMAT_ERROR;
            return U_INT64_MIN;
        } else if (fabs(fValue.fDouble) > U_DOUBLE_MAX_EXACT_INT && fDecimalQuantity != NULL) {
            if (fDecimalQuantity->fitsInLong(true)) {
                return fDecimalQuantity->toLong();
            } else {
                // Unexpected
                status = U_INVALID_FORMAT_ERROR;
                return fDecimalQuantity->isNegative() ? U_INT64_MIN : U_INT64_MAX;
            }
        } else {
            return (int64_t)fValue.fDouble;
        } 
    case Formattable::kObject:
        if (fValue.fObject == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }
        if (instanceOfMeasure(fValue.fObject)) {
            return ((const Measure*) fValue.fObject)->
                getNumber().getInt64(status);
        }
        U_FALLTHROUGH;
    default:
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
}